

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testPreviewImage.cpp
# Opt level: O0

void anon_unknown.dwarf_1eac8a::readWriteFiles(char *fileName1,char *fileName2,char *fileName3)

{
  uchar uVar1;
  char *pcVar2;
  byte bVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  ostream *poVar7;
  Rgba *pRVar8;
  PreviewRgba *pPVar9;
  Header *pHVar10;
  char *in_RDX;
  char *in_RSI;
  char *in_RDI;
  float fVar11;
  float fVar12;
  int c3;
  int c2;
  ifstream file3_1;
  ifstream file2_2;
  int y_2;
  RgbaOutputFile file3;
  Header header_1;
  int i_1;
  Array<Imf_3_2::Rgba> pixels2;
  int dy_1;
  int dx_1;
  int h_1;
  int w_1;
  int i;
  PreviewImage *preview2;
  RgbaInputFile file2_1;
  int y_1;
  RgbaOutputFile file2;
  Header header;
  int x;
  int y;
  PreviewImage preview1;
  int PREVIEW_HEIGHT;
  int PREVIEW_WIDTH;
  Array<Imf_3_2::Rgba> pixels1;
  int dy;
  int dx;
  int h;
  int w;
  Box2i *dw;
  RgbaInputFile file1;
  char *in_stack_fffffffffffff7d8;
  undefined4 in_stack_fffffffffffff7e0;
  byte in_stack_fffffffffffff7e4;
  byte in_stack_fffffffffffff7e5;
  byte in_stack_fffffffffffff7e6;
  undefined1 in_stack_fffffffffffff7e7;
  undefined4 in_stack_fffffffffffff7e8;
  undefined4 in_stack_fffffffffffff7ec;
  Box<Imath_3_2::Vec2<int>_> *in_stack_fffffffffffff7f0;
  long in_stack_fffffffffffff818;
  Array<Imf_3_2::Rgba> *in_stack_fffffffffffff820;
  long local_600 [65];
  long local_3f8 [65];
  int local_1ec;
  Rgba local_1e8 [3];
  PreviewImage local_1d0 [16];
  Header local_1c0 [60];
  int local_184;
  Array local_180 [20];
  int local_16c;
  int local_168;
  int local_164;
  int local_160;
  int local_15c;
  PreviewImage *local_158;
  Rgba local_150 [8];
  int local_10c;
  Rgba local_108 [3];
  Header local_f0 [60];
  PreviewRgba local_b4;
  uint local_b0;
  uint local_ac;
  PreviewImage local_a8 [16];
  undefined4 local_98;
  undefined4 local_94;
  Array local_90 [16];
  int local_80;
  int local_7c;
  int local_78;
  int local_74;
  int *local_70;
  Rgba local_58 [8];
  char *local_18;
  char *local_10;
  char *local_8;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  poVar7 = std::operator<<((ostream *)&std::cout,"reading file ");
  poVar7 = std::operator<<(poVar7,local_8);
  std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
  iVar5 = Imf_3_2::globalThreadCount();
  Imf_3_2::RgbaInputFile::RgbaInputFile((RgbaInputFile *)local_58,local_8,iVar5);
  Imf_3_2::RgbaInputFile::header();
  bVar3 = Imf_3_2::Header::hasPreviewImage();
  if (((bVar3 ^ 0xff) & 1) == 0) {
    __assert_fail("!file1.header ().hasPreviewImage ()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testPreviewImage.cpp"
                  ,0x39,
                  "void (anonymous namespace)::readWriteFiles(const char *, const char *, const char *)"
                 );
  }
  local_70 = (int *)Imf_3_2::RgbaInputFile::dataWindow();
  local_74 = (local_70[2] - *local_70) + 1;
  local_78 = (local_70[3] - local_70[1]) + 1;
  local_7c = *local_70;
  local_80 = local_70[1];
  Imf_3_2::Array<Imf_3_2::Rgba>::Array(in_stack_fffffffffffff820,in_stack_fffffffffffff818);
  pRVar8 = Imf_3_2::Array::operator_cast_to_Rgba_(local_90);
  Imf_3_2::RgbaInputFile::setFrameBuffer
            (local_58,(ulong)(pRVar8 + (-(long)local_7c - (long)(local_80 * local_74))),1);
  Imf_3_2::RgbaInputFile::readPixels((int)local_58,local_70[1]);
  poVar7 = std::operator<<((ostream *)&std::cout,"generating preview image");
  std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
  local_94 = 0x80;
  local_98 = 0x40;
  Imf_3_2::PreviewImage::PreviewImage(local_a8,0x80,0x40,(PreviewRgba *)0x0);
  for (local_ac = 0; (int)local_ac < 0x40; local_ac = local_ac + 1) {
    for (local_b0 = 0; (int)local_b0 < 0x80; local_b0 = local_b0 + 1) {
      Imf_3_2::PreviewRgba::PreviewRgba
                (&local_b4,(char)local_b0 * '\x02',(uchar)(local_ac << 2),
                 (char)local_b0 + (char)local_ac,0x80);
      pPVar9 = Imf_3_2::PreviewImage::pixel(local_a8,local_b0,local_ac);
      *pPVar9 = local_b4;
    }
  }
  poVar7 = std::operator<<((ostream *)&std::cout,"writing file ");
  poVar7 = std::operator<<(poVar7,local_10);
  std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
  pHVar10 = (Header *)Imf_3_2::RgbaInputFile::header();
  Imf_3_2::Header::Header(local_f0,pHVar10);
  Imf_3_2::Header::setPreviewImage((PreviewImage *)local_f0);
  pcVar2 = local_10;
  iVar5 = Imf_3_2::globalThreadCount();
  Imf_3_2::RgbaOutputFile::RgbaOutputFile
            ((RgbaOutputFile *)local_108,pcVar2,local_f0,WRITE_RGBA,iVar5);
  pRVar8 = Imf_3_2::Array::operator_cast_to_Rgba_(local_90);
  Imf_3_2::RgbaOutputFile::setFrameBuffer
            (local_108,(ulong)(pRVar8 + (-(long)local_7c - (long)(local_80 * local_74))),1);
  for (local_10c = local_70[1]; local_10c <= local_70[3]; local_10c = local_10c + 1) {
    Imf_3_2::RgbaOutputFile::writePixels((int)local_108);
  }
  Imf_3_2::RgbaOutputFile::~RgbaOutputFile((RgbaOutputFile *)local_108);
  Imf_3_2::Header::~Header(local_f0);
  poVar7 = std::operator<<((ostream *)&std::cout,"reading file ");
  poVar7 = std::operator<<(poVar7,local_10);
  std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
  pcVar2 = local_10;
  iVar5 = Imf_3_2::globalThreadCount();
  Imf_3_2::RgbaInputFile::RgbaInputFile((RgbaInputFile *)local_150,pcVar2,iVar5);
  Imf_3_2::RgbaInputFile::header();
  bVar3 = Imf_3_2::Header::hasPreviewImage();
  if ((bVar3 & 1) == 0) {
    __assert_fail("file2.header ().hasPreviewImage ()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testPreviewImage.cpp"
                  ,99,
                  "void (anonymous namespace)::readWriteFiles(const char *, const char *, const char *)"
                 );
  }
  Imf_3_2::RgbaInputFile::header();
  local_158 = (PreviewImage *)Imf_3_2::Header::previewImage();
  local_15c = 0;
  while( true ) {
    if (0x1fff < local_15c) {
      Imf_3_2::RgbaInputFile::dataWindow();
      bVar4 = Imath_3_2::Box<Imath_3_2::Vec2<int>_>::operator==
                        (in_stack_fffffffffffff7f0,
                         (Box<Imath_3_2::Vec2<int>_> *)
                         CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8));
      if (!bVar4) {
        __assert_fail("dw == file2.dataWindow ()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testPreviewImage.cpp"
                      ,0x6f,
                      "void (anonymous namespace)::readWriteFiles(const char *, const char *, const char *)"
                     );
      }
      local_160 = (local_70[2] - *local_70) + 1;
      local_164 = (local_70[3] - local_70[1]) + 1;
      local_168 = *local_70;
      local_16c = local_70[1];
      Imf_3_2::Array<Imf_3_2::Rgba>::Array(in_stack_fffffffffffff820,in_stack_fffffffffffff818);
      pRVar8 = Imf_3_2::Array::operator_cast_to_Rgba_(local_180);
      Imf_3_2::RgbaInputFile::setFrameBuffer
                (local_150,(ulong)(pRVar8 + (-(long)local_168 - (long)(local_16c * local_160))),1);
      Imf_3_2::RgbaInputFile::readPixels((int)local_150,local_70[1]);
      local_184 = 0;
      while( true ) {
        if (local_160 * local_164 <= local_184) {
          Imf_3_2::Array<Imf_3_2::Rgba>::~Array
                    ((Array<Imf_3_2::Rgba> *)
                     CONCAT17(in_stack_fffffffffffff7e7,
                              CONCAT16(in_stack_fffffffffffff7e6,
                                       CONCAT15(in_stack_fffffffffffff7e5,
                                                CONCAT14(in_stack_fffffffffffff7e4,
                                                         in_stack_fffffffffffff7e0)))));
          Imf_3_2::RgbaInputFile::~RgbaInputFile((RgbaInputFile *)local_150);
          poVar7 = std::operator<<((ostream *)&std::cout,"writing file ");
          poVar7 = std::operator<<(poVar7,local_18);
          std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
          pHVar10 = (Header *)Imf_3_2::RgbaInputFile::header();
          Imf_3_2::Header::Header(local_1c0,pHVar10);
          Imf_3_2::PreviewImage::PreviewImage(local_1d0,0x80,0x40,(PreviewRgba *)0x0);
          Imf_3_2::Header::setPreviewImage((PreviewImage *)local_1c0);
          Imf_3_2::PreviewImage::~PreviewImage(local_1d0);
          pcVar2 = local_18;
          iVar5 = Imf_3_2::globalThreadCount();
          Imf_3_2::RgbaOutputFile::RgbaOutputFile
                    ((RgbaOutputFile *)local_1e8,pcVar2,local_1c0,WRITE_RGBA,iVar5);
          pRVar8 = Imf_3_2::Array::operator_cast_to_Rgba_(local_90);
          Imf_3_2::RgbaOutputFile::setFrameBuffer
                    (local_1e8,(ulong)(pRVar8 + (-(long)local_7c - (long)(local_80 * local_74))),1);
          for (local_1ec = local_70[1]; local_1ec <= local_70[3]; local_1ec = local_1ec + 1) {
            Imf_3_2::RgbaOutputFile::writePixels((int)local_1e8);
            if (local_1ec == (local_70[1] + local_70[3]) / 2) {
              Imf_3_2::PreviewImage::pixels(local_a8);
              Imf_3_2::RgbaOutputFile::updatePreviewImage((PreviewRgba *)local_1e8);
            }
          }
          Imf_3_2::RgbaOutputFile::~RgbaOutputFile((RgbaOutputFile *)local_1e8);
          Imf_3_2::Header::~Header(local_1c0);
          poVar7 = std::operator<<((ostream *)&std::cout,"comparing files ");
          poVar7 = std::operator<<(poVar7,local_10);
          poVar7 = std::operator<<(poVar7," and ");
          poVar7 = std::operator<<(poVar7,local_18);
          std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
          std::ifstream::ifstream(local_3f8);
          std::ifstream::ifstream(local_600);
          std::operator|(_S_in,_S_bin);
          testutil::OpenStreamWithUTF8Name<std::ifstream>
                    ((basic_ifstream<char,_std::char_traits<char>_> *)
                     CONCAT17(in_stack_fffffffffffff7e7,
                              CONCAT16(in_stack_fffffffffffff7e6,
                                       CONCAT15(in_stack_fffffffffffff7e5,
                                                CONCAT14(in_stack_fffffffffffff7e4,
                                                         in_stack_fffffffffffff7e0)))),
                     in_stack_fffffffffffff7d8,~(_S_ios_openmode_min|_S_ios_openmode_max));
          std::operator|(_S_in,_S_bin);
          testutil::OpenStreamWithUTF8Name<std::ifstream>
                    ((basic_ifstream<char,_std::char_traits<char>_> *)
                     CONCAT17(in_stack_fffffffffffff7e7,
                              CONCAT16(in_stack_fffffffffffff7e6,
                                       CONCAT15(in_stack_fffffffffffff7e5,
                                                CONCAT14(in_stack_fffffffffffff7e4,
                                                         in_stack_fffffffffffff7e0)))),
                     in_stack_fffffffffffff7d8,~(_S_ios_openmode_min|_S_ios_openmode_max));
          while( true ) {
            iVar5 = std::istream::get();
            iVar6 = std::istream::get();
            bVar3 = std::ios::eof();
            if ((bVar3 & 1) != 0) {
              std::ifstream::~ifstream(local_600);
              std::ifstream::~ifstream(local_3f8);
              remove(local_10);
              remove(local_18);
              Imf_3_2::PreviewImage::~PreviewImage(local_a8);
              Imf_3_2::Array<Imf_3_2::Rgba>::~Array
                        ((Array<Imf_3_2::Rgba> *)
                         CONCAT17(bVar3,CONCAT16(in_stack_fffffffffffff7e6,
                                                 CONCAT15(in_stack_fffffffffffff7e5,
                                                          CONCAT14(in_stack_fffffffffffff7e4,
                                                                   in_stack_fffffffffffff7e0)))));
              Imf_3_2::RgbaInputFile::~RgbaInputFile((RgbaInputFile *)local_58);
              return;
            }
            if (iVar5 != iVar6) break;
            in_stack_fffffffffffff7e6 =
                 std::ios::operator!((ios *)((long)local_3f8 + *(long *)(local_3f8[0] + -0x18)));
            in_stack_fffffffffffff7e5 = 0;
            if ((in_stack_fffffffffffff7e6 & 1) == 0) {
              in_stack_fffffffffffff7e4 =
                   std::ios::operator!((ios *)((long)local_600 + *(long *)(local_600[0] + -0x18)));
              in_stack_fffffffffffff7e5 = in_stack_fffffffffffff7e4 ^ 0xff;
            }
            if ((in_stack_fffffffffffff7e5 & 1) == 0) {
              __assert_fail("!!file2 && !!file3",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testPreviewImage.cpp"
                            ,0xa6,
                            "void (anonymous namespace)::readWriteFiles(const char *, const char *, const char *)"
                           );
            }
          }
          __assert_fail("c2 == c3",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testPreviewImage.cpp"
                        ,0xa5,
                        "void (anonymous namespace)::readWriteFiles(const char *, const char *, const char *)"
                       );
        }
        Imf_3_2::Array::operator_cast_to_Rgba_(local_90);
        fVar11 = Imath_3_2::half::operator_cast_to_float
                           ((half *)CONCAT17(in_stack_fffffffffffff7e7,
                                             CONCAT16(in_stack_fffffffffffff7e6,
                                                      CONCAT15(in_stack_fffffffffffff7e5,
                                                               CONCAT14(in_stack_fffffffffffff7e4,
                                                                        in_stack_fffffffffffff7e0)))
                                            ));
        Imf_3_2::Array::operator_cast_to_Rgba_(local_180);
        fVar12 = Imath_3_2::half::operator_cast_to_float
                           ((half *)CONCAT17(in_stack_fffffffffffff7e7,
                                             CONCAT16(in_stack_fffffffffffff7e6,
                                                      CONCAT15(in_stack_fffffffffffff7e5,
                                                               CONCAT14(in_stack_fffffffffffff7e4,
                                                                        in_stack_fffffffffffff7e0)))
                                            ));
        if ((fVar11 != fVar12) || (NAN(fVar11) || NAN(fVar12))) {
          __assert_fail("pixels1[i].r == pixels2[i].r",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testPreviewImage.cpp"
                        ,0x7c,
                        "void (anonymous namespace)::readWriteFiles(const char *, const char *, const char *)"
                       );
        }
        Imf_3_2::Array::operator_cast_to_Rgba_(local_90);
        fVar11 = Imath_3_2::half::operator_cast_to_float
                           ((half *)CONCAT17(in_stack_fffffffffffff7e7,
                                             CONCAT16(in_stack_fffffffffffff7e6,
                                                      CONCAT15(in_stack_fffffffffffff7e5,
                                                               CONCAT14(in_stack_fffffffffffff7e4,
                                                                        in_stack_fffffffffffff7e0)))
                                            ));
        Imf_3_2::Array::operator_cast_to_Rgba_(local_180);
        fVar12 = Imath_3_2::half::operator_cast_to_float
                           ((half *)CONCAT17(in_stack_fffffffffffff7e7,
                                             CONCAT16(in_stack_fffffffffffff7e6,
                                                      CONCAT15(in_stack_fffffffffffff7e5,
                                                               CONCAT14(in_stack_fffffffffffff7e4,
                                                                        in_stack_fffffffffffff7e0)))
                                            ));
        if ((fVar11 != fVar12) || (NAN(fVar11) || NAN(fVar12))) break;
        Imf_3_2::Array::operator_cast_to_Rgba_(local_90);
        fVar11 = Imath_3_2::half::operator_cast_to_float
                           ((half *)CONCAT17(in_stack_fffffffffffff7e7,
                                             CONCAT16(in_stack_fffffffffffff7e6,
                                                      CONCAT15(in_stack_fffffffffffff7e5,
                                                               CONCAT14(in_stack_fffffffffffff7e4,
                                                                        in_stack_fffffffffffff7e0)))
                                            ));
        Imf_3_2::Array::operator_cast_to_Rgba_(local_180);
        fVar12 = Imath_3_2::half::operator_cast_to_float
                           ((half *)CONCAT17(in_stack_fffffffffffff7e7,
                                             CONCAT16(in_stack_fffffffffffff7e6,
                                                      CONCAT15(in_stack_fffffffffffff7e5,
                                                               CONCAT14(in_stack_fffffffffffff7e4,
                                                                        in_stack_fffffffffffff7e0)))
                                            ));
        if ((fVar11 != fVar12) || (NAN(fVar11) || NAN(fVar12))) {
          __assert_fail("pixels1[i].b == pixels2[i].b",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testPreviewImage.cpp"
                        ,0x7e,
                        "void (anonymous namespace)::readWriteFiles(const char *, const char *, const char *)"
                       );
        }
        Imf_3_2::Array::operator_cast_to_Rgba_(local_90);
        fVar11 = Imath_3_2::half::operator_cast_to_float
                           ((half *)CONCAT17(in_stack_fffffffffffff7e7,
                                             CONCAT16(in_stack_fffffffffffff7e6,
                                                      CONCAT15(in_stack_fffffffffffff7e5,
                                                               CONCAT14(in_stack_fffffffffffff7e4,
                                                                        in_stack_fffffffffffff7e0)))
                                            ));
        Imf_3_2::Array::operator_cast_to_Rgba_(local_180);
        fVar12 = Imath_3_2::half::operator_cast_to_float
                           ((half *)CONCAT17(in_stack_fffffffffffff7e7,
                                             CONCAT16(in_stack_fffffffffffff7e6,
                                                      CONCAT15(in_stack_fffffffffffff7e5,
                                                               CONCAT14(in_stack_fffffffffffff7e4,
                                                                        in_stack_fffffffffffff7e0)))
                                            ));
        if ((fVar11 != fVar12) || (NAN(fVar11) || NAN(fVar12))) {
          __assert_fail("pixels1[i].a == pixels2[i].a",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testPreviewImage.cpp"
                        ,0x7f,
                        "void (anonymous namespace)::readWriteFiles(const char *, const char *, const char *)"
                       );
        }
        local_184 = local_184 + 1;
      }
      __assert_fail("pixels1[i].g == pixels2[i].g",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testPreviewImage.cpp"
                    ,0x7d,
                    "void (anonymous namespace)::readWriteFiles(const char *, const char *, const char *)"
                   );
    }
    pPVar9 = Imf_3_2::PreviewImage::pixels(local_a8);
    uVar1 = pPVar9[local_15c].r;
    pPVar9 = Imf_3_2::PreviewImage::pixels(local_158);
    if (uVar1 != pPVar9[local_15c].r) {
      __assert_fail("preview1.pixels ()[i].r == preview2.pixels ()[i].r",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testPreviewImage.cpp"
                    ,0x69,
                    "void (anonymous namespace)::readWriteFiles(const char *, const char *, const char *)"
                   );
    }
    pPVar9 = Imf_3_2::PreviewImage::pixels(local_a8);
    uVar1 = pPVar9[local_15c].g;
    pPVar9 = Imf_3_2::PreviewImage::pixels(local_158);
    if (uVar1 != pPVar9[local_15c].g) {
      __assert_fail("preview1.pixels ()[i].g == preview2.pixels ()[i].g",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testPreviewImage.cpp"
                    ,0x6a,
                    "void (anonymous namespace)::readWriteFiles(const char *, const char *, const char *)"
                   );
    }
    pPVar9 = Imf_3_2::PreviewImage::pixels(local_a8);
    uVar1 = pPVar9[local_15c].b;
    pPVar9 = Imf_3_2::PreviewImage::pixels(local_158);
    if (uVar1 != pPVar9[local_15c].b) {
      __assert_fail("preview1.pixels ()[i].b == preview2.pixels ()[i].b",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testPreviewImage.cpp"
                    ,0x6b,
                    "void (anonymous namespace)::readWriteFiles(const char *, const char *, const char *)"
                   );
    }
    pPVar9 = Imf_3_2::PreviewImage::pixels(local_a8);
    uVar1 = pPVar9[local_15c].a;
    pPVar9 = Imf_3_2::PreviewImage::pixels(local_158);
    if (uVar1 != pPVar9[local_15c].a) break;
    local_15c = local_15c + 1;
  }
  __assert_fail("preview1.pixels ()[i].a == preview2.pixels ()[i].a",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testPreviewImage.cpp"
                ,0x6c,
                "void (anonymous namespace)::readWriteFiles(const char *, const char *, const char *)"
               );
}

Assistant:

void
readWriteFiles (
    const char fileName1[], const char fileName2[], const char fileName3[])
{
    //
    // Test if the preview image attribute works correctly:
    //
    // Read file1, which does not contain a preview image.
    //
    // Generate a preview image, and store both the pixels
    // from file 1 and the preview image in file 2.
    //
    // Read file 2, and verify that both the preview image, and
    // the main image are exactly what we stored in the file.
    //
    // Write file 3, with the same main image as file 2, but
    // initially leave the preview image blank.  Update the
    // preview image half way through writing the main image's
    // pixels.
    //
    // Compare file 2 and file 3 byte by byte, and verify that
    // the files are identical.
    //

    cout << "reading file " << fileName1 << endl;

    RgbaInputFile file1 (fileName1);

    assert (!file1.header ().hasPreviewImage ());

    const Box2i& dw = file1.dataWindow ();

    int w  = dw.max.x - dw.min.x + 1;
    int h  = dw.max.y - dw.min.y + 1;
    int dx = dw.min.x;
    int dy = dw.min.y;

    Array<OPENEXR_IMF_NAMESPACE::Rgba> pixels1 (w * h);
    file1.setFrameBuffer (pixels1 - dx - dy * w, 1, w);
    file1.readPixels (dw.min.y, dw.max.y);

    cout << "generating preview image" << endl;

    const int PREVIEW_WIDTH  = 128;
    const int PREVIEW_HEIGHT = 64;

    PreviewImage preview1 (PREVIEW_WIDTH, PREVIEW_HEIGHT);

    for (int y = 0; y < PREVIEW_HEIGHT; ++y)
        for (int x = 0; x < PREVIEW_WIDTH; ++x)
            preview1.pixel (x, y) = PreviewRgba (x * 2, y * 4, x + y, 128);

    cout << "writing file " << fileName2 << endl;

    {
        Header header (file1.header ());
        header.setPreviewImage (preview1);

        RgbaOutputFile file2 (fileName2, header);
        file2.setFrameBuffer (pixels1 - dx - dy * w, 1, w);

        for (int y = dw.min.y; y <= dw.max.y; ++y)
            file2.writePixels (1);
    }

    cout << "reading file " << fileName2 << endl;

    {
        RgbaInputFile file2 (fileName2);

        assert (file2.header ().hasPreviewImage ());

        const PreviewImage& preview2 = file2.header ().previewImage ();

        for (int i = 0; i < PREVIEW_WIDTH * PREVIEW_HEIGHT; ++i)
        {
            assert (preview1.pixels ()[i].r == preview2.pixels ()[i].r);
            assert (preview1.pixels ()[i].g == preview2.pixels ()[i].g);
            assert (preview1.pixels ()[i].b == preview2.pixels ()[i].b);
            assert (preview1.pixels ()[i].a == preview2.pixels ()[i].a);
        }

        assert (dw == file2.dataWindow ());

        int w  = dw.max.x - dw.min.x + 1;
        int h  = dw.max.y - dw.min.y + 1;
        int dx = dw.min.x;
        int dy = dw.min.y;

        Array<OPENEXR_IMF_NAMESPACE::Rgba> pixels2 (w * h);
        file2.setFrameBuffer (pixels2 - dx - dy * w, 1, w);
        file2.readPixels (dw.min.y, dw.max.y);

        for (int i = 0; i < w * h; ++i)
        {
            assert (pixels1[i].r == pixels2[i].r);
            assert (pixels1[i].g == pixels2[i].g);
            assert (pixels1[i].b == pixels2[i].b);
            assert (pixels1[i].a == pixels2[i].a);
        }
    }

    cout << "writing file " << fileName3 << endl;

    {
        Header header (file1.header ());
        header.setPreviewImage (PreviewImage (PREVIEW_WIDTH, PREVIEW_HEIGHT));

        RgbaOutputFile file3 (fileName3, header);
        file3.setFrameBuffer (pixels1 - dx - dy * w, 1, w);

        for (int y = dw.min.y; y <= dw.max.y; ++y)
        {
            file3.writePixels (1);

            if (y == (dw.min.y + dw.max.y) / 2)
                file3.updatePreviewImage (preview1.pixels ());
        }
    }

    cout << "comparing files " << fileName2 << " and " << fileName3 << endl;

    {
        ifstream file2, file3;
        testutil::OpenStreamWithUTF8Name (
            file2, fileName2, std::ios_base::in | std::ios_base::binary);
        testutil::OpenStreamWithUTF8Name (
            file3, fileName3, std::ios_base::in | std::ios_base::binary);

        while (true)
        {
            int c2 = file2.get ();
            int c3 = file3.get ();

            if (file2.eof ()) break;

            assert (c2 == c3);
            assert (!!file2 && !!file3);
        }
    }

    remove (fileName2);
    remove (fileName3);
}